

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O3

hdr_histogram *
hdr_interval_recorder_sample_and_recycle
          (hdr_interval_recorder *r,hdr_histogram *histogram_to_recycle)

{
  hdr_writer_reader_phaser *p;
  hdr_histogram *phVar1;
  hdr_histogram *local_20;
  
  local_20 = histogram_to_recycle;
  if (histogram_to_recycle == (hdr_histogram *)0x0) {
    phVar1 = r->active;
    hdr_init(phVar1->lowest_discernible_value,phVar1->highest_trackable_value,
             phVar1->significant_figures,&local_20);
  }
  else {
    hdr_reset(histogram_to_recycle);
  }
  p = &r->phaser;
  hdr_phaser_reader_lock(p);
  phVar1 = r->active;
  LOCK();
  r->active = local_20;
  UNLOCK();
  hdr_phaser_flip_phase(p,0);
  hdr_phaser_reader_unlock(p);
  return phVar1;
}

Assistant:

struct hdr_histogram* hdr_interval_recorder_sample_and_recycle(
    struct hdr_interval_recorder* r,
    struct hdr_histogram* histogram_to_recycle)
{
    struct hdr_histogram* old_active;

    if (NULL == histogram_to_recycle)
    {
        int64_t lo = r->active->lowest_discernible_value;
        int64_t hi = r->active->highest_trackable_value;
        int significant_figures = r->active->significant_figures;
        hdr_init(lo, hi, significant_figures, &histogram_to_recycle);
    }
    else
    {
        hdr_reset(histogram_to_recycle);
    }

    hdr_phaser_reader_lock(&r->phaser);

    /* volatile read */
    old_active = hdr_atomic_load_pointer(&r->active);

    /* volatile write */
    hdr_atomic_store_pointer(&r->active, histogram_to_recycle);

    hdr_phaser_flip_phase(&r->phaser, 0);

    hdr_phaser_reader_unlock(&r->phaser);

    return old_active;
}